

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O2

void amrex::readIntData<int,short>(int *data,size_t size,istream *is,IntDescriptor *id)

{
  short sVar1;
  Ordering OVar2;
  Ordering OVar3;
  undefined8 in_RAX;
  IntDescriptor *this;
  size_t j;
  size_t sVar4;
  undefined6 uStack_38;
  short value;
  
  _uStack_38 = in_RAX;
  OVar2 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar3 = IntDescriptor::order(this);
  for (sVar4 = 0; size != sVar4; sVar4 = sVar4 + 1) {
    std::istream::read((char *)is,(long)&value);
    sVar1 = value;
    if (OVar2 != OVar3) {
      sVar1 = swapBytes(value);
      _uStack_38 = CONCAT26(sVar1,uStack_38);
    }
    data[sVar4] = (int)sVar1;
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }